

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

bool __thiscall
google::protobuf::Reflection::InsertOrLookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,MapValueRef *val)

{
  bool bVar1;
  undefined1 uVar2;
  uint32_t uVar3;
  Descriptor *this_00;
  FieldDescriptor *pFVar4;
  string local_60;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  bVar1 = anon_unknown_0::IsMapFieldInApi(field);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"InsertOrLookupMapValue\"","Field is not a map field.");
  }
  this_00 = FieldDescriptor::message_type(field);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"value","");
  pFVar4 = Descriptor::FindFieldByName(this_00,&local_60);
  if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_40 = pFVar4;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar4 + 0x18),&local_38,&local_40);
  }
  (val->super_MapValueConstRef).type_ =
       *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar4[2] * 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  uVar2 = (**(code **)(*(long *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                                (ulong)uVar3) + 0x18))
                    ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3,key,val);
  return (bool)uVar2;
}

Assistant:

bool Reflection::InsertOrLookupMapValue(Message* message,
                                        const FieldDescriptor* field,
                                        const MapKey& key,
                                        MapValueRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), "InsertOrLookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return MutableRaw<MapFieldBase>(message, field)
      ->InsertOrLookupMapValue(key, val);
}